

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

value * mjs::json_parse(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                       vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  value *pvVar1;
  pointer pvVar2;
  bool bVar3;
  gc_heap_ptr_untyped *this;
  long *plVar4;
  long *plVar5;
  wstring_view wVar6;
  size_t in_stack_fffffffffffffee8;
  gc_heap *pgVar7;
  object_ptr holder;
  gc_heap_ptr_untyped local_d8;
  value val;
  json_lexer lex;
  
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (v == pvVar1) {
    pgVar7 = (gc_heap *)0x9;
  }
  else {
    to_string((mjs *)&local_d8,(global->super_gc_heap_ptr_untyped).heap_,v);
    wVar6 = string::view((string *)&local_d8);
    pgVar7 = (gc_heap *)wVar6._M_len;
  }
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&holder,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&stack0xfffffffffffffef0,
             (allocator<wchar_t> *)&stack0xfffffffffffffeef);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&lex,&global->super_gc_heap_ptr_untyped);
  std::__cxx11::wstring::wstring((wstring *)&lex.text_,(wstring *)&holder);
  lex.pos_ = 0;
  lex.tok_.type_ = eof;
  lex.tok_.text_._M_dataplus._M_p = (pointer)&lex.tok_.text_.field_2;
  lex.tok_.text_._M_string_length = 0;
  lex.tok_.text_.field_2._M_local_buf[0] = L'\0';
  lex.tok_.pos_ = 0;
  anon_unknown_46::json_lexer::next_token((json_token *)&val,&lex);
  std::__cxx11::wstring::~wstring((wstring *)&val.field_1.s_);
  std::__cxx11::wstring::~wstring((wstring *)&holder);
  if (v != pvVar1) {
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
  }
  anon_unknown_46::json_parse_value(&val,&lex);
  anon_unknown_46::json_lexer::skip_whitespace(&lex);
  if (lex.tok_.type_ != eof) {
    anon_unknown_46::json_lexer::throw_unexpected(&lex);
  }
  pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((1 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x28)) &&
     (pvVar2[1].type_ == object)) {
    this = &value::object_value(pvVar2 + 1)->super_gc_heap_ptr_untyped;
    bVar3 = gc_heap_ptr_untyped::has_type<mjs::function_object>(this);
    if (bVar3) {
      gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      global_object::make_object((global_object *)&holder);
      plVar4 = (long *)gc_heap_ptr_untyped::get(&holder.super_gc_heap_ptr_untyped);
      plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar5 + 0x98))(&stack0xfffffffffffffef0,plVar5,"");
      (**(code **)(*plVar4 + 8))(plVar4,&stack0xfffffffffffffef0,&val,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xfffffffffffffef0);
      wVar6._M_str = (wchar_t *)pgVar7;
      wVar6._M_len = in_stack_fffffffffffffee8;
      anon_unknown_46::json_walk
                (__return_storage_ptr__,(anon_unknown_46 *)global,
                 (gc_heap_ptr<mjs::global_object> *)
                 ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                  super__Vector_impl_data._M_start + 1),(value *)&holder,(object_ptr *)0x0,wVar6);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&holder.super_gc_heap_ptr_untyped);
      goto LAB_001565d4;
    }
  }
  value::value(__return_storage_ptr__,&val);
LAB_001565d4:
  value::~value(&val);
  anon_unknown_46::json_lexer::~json_lexer(&lex);
  return __return_storage_ptr__;
}

Assistant:

value json_parse(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) {
    json_lexer lex{global, std::wstring{args.empty() ? L"undefined" : to_string(global.heap(), args.front()).view()}};
    value val = json_parse_value(lex);
    lex.skip_whitespace();
    if (!lex.eof()) {
        lex.throw_unexpected();
    }
    if (args.size() > 1 && args[1].type() == value_type::object && args[1].object_value().has_type<function_object>()) {
        auto holder = global->make_object();
        holder->put(global->common_string(""), val);
        return json_walk(global, args[1], holder, L"");
    }
    return val;
}